

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPMINRES.cpp
# Opt level: O3

double __thiscall chrono::ChSolverPMINRES::Solve(ChSolverPMINRES *this,ChSystemDescriptor *sysd)

{
  int *piVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChConstraint *pCVar7;
  ChVariables *this_00;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Index IVar13;
  double *pdVar14;
  Index IVar15;
  double *pdVar16;
  int iVar17;
  uint uVar18;
  Index size;
  ChLog *pCVar19;
  ChStreamOutAscii *pCVar20;
  pointer ppCVar21;
  pointer ppCVar22;
  Index index_6;
  pointer ppCVar23;
  pointer ppCVar24;
  char *pcVar25;
  Index index_3;
  ChSolverPMINRES *pCVar26;
  SrcEvaluatorType srcEvaluator_1;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  SrcEvaluatorType srcEvaluator;
  Index dstRows;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  double dVar34;
  Scalar SVar35;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 uVar36;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar42 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 in_XMM3 [16];
  ChVectorDynamic<> mz;
  ChVectorDynamic<> mr;
  ChVectorDynamic<> ml;
  ChVectorDynamic<> mtmp;
  ChVectorDynamic<> mp;
  ChVectorDynamic<> mb;
  ChVectorDynamic<> mNMr;
  ChVectorDynamic<> mMNp;
  ChVectorDynamic<> mNp;
  ChVectorDynamic<> mDi;
  ChVectorDynamic<> mNMr_old;
  ChVectorDynamic<> mz_old;
  ChVectorDynamic<> mq;
  double gi_values [3];
  scalar_max_op<double,_double,_0> local_1f1;
  ChSolverPMINRES *local_1f0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1e8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1d8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1c8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1b8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1a8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_198;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_188;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_178;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_160;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_148;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_138;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_128;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_f8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_e0;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_d8;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_d0;
  long local_c8;
  undefined8 uStack_c0;
  Scalar local_b8;
  undefined8 uStack_b0;
  Scalar local_a0;
  long local_98 [3];
  double local_80;
  double local_78 [4];
  undefined8 local_58;
  undefined8 uStack_50;
  ChVectorRef local_48;
  
  if ((sysd->vstiffness).super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (sysd->vstiffness).super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    dVar34 = Solve_SupportingStiffness(this,sysd);
    return dVar34;
  }
  iVar17 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  local_1f0 = this;
  if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
    pCVar19 = GetLog();
    pCVar20 = ChStreamOutAscii::operator<<
                        (&pCVar19->super_ChStreamOutAscii,"\n-----Projected MINRES, solving nc=");
    pCVar20 = ChStreamOutAscii::operator<<(pCVar20,iVar17);
    ChStreamOutAscii::operator<<(pCVar20,"unknowns \n");
  }
  lVar29 = (long)iVar17;
  local_1c8.m_storage.m_data = (double *)0x0;
  local_1c8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1c8,lVar29);
  local_198.m_storage.m_data = (double *)0x0;
  local_198.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_198,lVar29);
  local_1a8.m_storage.m_data = (double *)0x0;
  local_1a8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1a8,lVar29);
  local_1d8.m_storage.m_data = (double *)0x0;
  local_1d8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1d8,lVar29);
  local_1e8.m_storage.m_data = (double *)0x0;
  local_1e8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1e8,lVar29);
  local_f8.m_storage.m_data = (double *)0x0;
  local_f8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_f8,lVar29);
  local_148.m_storage.m_data = (double *)0x0;
  local_148.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_148,lVar29);
  local_178.m_storage.m_data = (double *)0x0;
  local_178.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_178,lVar29);
  local_188.m_storage.m_data = (double *)0x0;
  local_188.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_188,lVar29);
  local_128.m_storage.m_data = (double *)0x0;
  local_128.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_128,lVar29);
  local_1b8.m_storage.m_data = (double *)0x0;
  local_1b8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_1b8,lVar29);
  auVar42 = ZEXT864(0) << 0x40;
  local_138.m_storage.m_data = (double *)0x0;
  local_138.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_138,lVar29);
  (local_1f0->super_ChIterativeSolverVI).m_iterations = 0;
  ppCVar22 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((sysd->vconstraints).
      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppCVar22) {
    uVar30 = 0;
  }
  else {
    uVar27 = 0;
    uVar28 = 1;
    do {
      (*ppCVar22[uVar27]->_vptr_ChConstraint[6])();
      ppCVar22 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      uVar30 = (long)(sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar22 >> 3;
      bVar8 = uVar28 < uVar30;
      uVar27 = uVar28;
      uVar28 = (ulong)((int)uVar28 + 1);
    } while (bVar8);
  }
  IVar13 = local_138.m_storage.m_rows;
  if (uVar30 != 0) {
    auVar42 = ZEXT1664(ZEXT816(0x4008000000000000));
    uVar18 = 1;
    iVar17 = 0;
    ppCVar24 = ppCVar22;
    do {
      pCVar7 = *ppCVar24;
      if (pCVar7->mode == CONSTRAINT_FRIC) {
        local_78[iVar17] = pCVar7->g_i;
        iVar17 = iVar17 + 1;
        if (iVar17 == 3) {
          dVar34 = (local_78[0] + local_78[1] + local_78[2]) / 3.0;
          ppCVar22[uVar18 - 3]->g_i = dVar34;
          ppCVar22[uVar18 - 2]->g_i = dVar34;
          iVar17 = 0;
          pCVar7->g_i = dVar34;
        }
      }
      uVar27 = (ulong)uVar18;
      ppCVar24 = ppCVar24 + 1;
      uVar18 = uVar18 + 1;
    } while (uVar27 < uVar30);
  }
  if (-1 < local_138.m_storage.m_rows) {
    if (local_138.m_storage.m_rows != 0) {
      memset(local_138.m_storage.m_data,0,local_138.m_storage.m_rows * 8);
    }
    if (uVar30 != 0) {
      auVar42 = ZEXT1664(ZEXT816(0x3ff0000000000000));
      uVar18 = 1;
      uVar27 = 0;
      iVar17 = 0;
      do {
        if (ppCVar22[uVar27]->active == true) {
          if ((iVar17 < 0) || (lVar29 = (long)iVar17, IVar13 <= lVar29)) goto LAB_007ba1ea;
          iVar17 = iVar17 + 1;
          local_138.m_storage.m_data[lVar29] = 1.0 / ppCVar22[uVar27]->g_i;
        }
        uVar27 = (ulong)uVar18;
        uVar18 = uVar18 + 1;
      } while (uVar27 < uVar30);
    }
    ppCVar21 = (sysd->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppCVar23 = (sysd->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar23 != ppCVar21) {
      uVar18 = 1;
      uVar30 = 0;
      do {
        this_00 = ppCVar21[uVar30];
        if (this_00->disabled == false) {
          ChVariables::Get_qb(&local_48,this_00);
          ChVariables::Get_fb((ChVectorRef *)&local_160,
                              (sysd->vvariables).
                              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar30]);
          auVar42 = ZEXT864(0) << 0x40;
          local_c8 = 0;
          uStack_c0 = 0;
          local_e0 = &(local_160.m_lhs)->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
          local_d8.m_d.data =
               (plainobjectbase_evaluator_data<double,_0>)
               (plainobjectbase_evaluator_data<double,_0>)local_160.m_rhs;
          if ((long)local_160.m_rhs < 0 &&
              &(local_160.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> !=
              (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                          "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                         );
          }
          (*this_00->_vptr_ChVariables[4])(this_00,&local_48,&local_e0);
          if (local_c8 != 0) {
            free(*(void **)(local_c8 + -8));
          }
          ppCVar21 = (sysd->vvariables).
                     super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppCVar23 = (sysd->vvariables).
                     super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar30 = (ulong)uVar18;
        uVar18 = uVar18 + 1;
      } while (uVar30 < (ulong)((long)ppCVar23 - (long)ppCVar21 >> 3));
    }
    pCVar26 = local_1f0;
    if (-1 < local_198.m_storage.m_rows) {
      if (local_198.m_storage.m_rows != 0) {
        memset(local_198.m_storage.m_data,0,local_198.m_storage.m_rows << 3);
      }
      ppCVar22 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar24 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar24 != ppCVar22) {
        iVar17 = 0;
        uVar30 = 0;
        uVar27 = 1;
        do {
          auVar31 = auVar42._0_16_;
          if (ppCVar22[uVar30]->active == true) {
            (*ppCVar22[uVar30]->_vptr_ChConstraint[7])();
            if ((iVar17 < 0) || (lVar29 = (long)iVar17, local_198.m_storage.m_rows <= lVar29)) {
LAB_007ba1ea:
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            auVar32._8_8_ = 0x8000000000000000;
            auVar32._0_8_ = 0x8000000000000000;
            auVar31 = vxorpd_avx512vl(auVar31,auVar32);
            auVar42 = ZEXT1664(auVar31);
            iVar17 = iVar17 + 1;
            pdVar2 = (double *)vmovlpd_avx(auVar31);
            (&((DenseStorage<double,__1,__1,_1,_0> *)local_198.m_storage.m_data)->m_data)[lVar29] =
                 pdVar2;
            ppCVar22 = (sysd->vconstraints).
                       super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppCVar24 = (sysd->vconstraints).
                       super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          }
          bVar8 = uVar27 < (ulong)((long)ppCVar24 - (long)ppCVar22 >> 3);
          uVar30 = uVar27;
          uVar27 = (ulong)((int)uVar27 + 1);
        } while (bVar8);
      }
      (*sysd->_vptr_ChSystemDescriptor[0xd])(sysd,&local_1b8);
      if (local_198.m_storage.m_rows != local_1b8.m_storage.m_rows) {
        pcVar25 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
        ;
LAB_007ba25a:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar25);
      }
      uVar30 = local_198.m_storage.m_rows + 7;
      if (-1 < local_198.m_storage.m_rows) {
        uVar30 = local_198.m_storage.m_rows;
      }
      uVar30 = uVar30 & 0xfffffffffffffff8;
      if (7 < local_198.m_storage.m_rows) {
        lVar29 = 0;
        do {
          auVar42 = vsubpd_avx512f(*(undefined1 (*) [64])
                                    (&((DenseStorage<double,__1,__1,_1,_0> *)
                                      local_198.m_storage.m_data)->m_data + lVar29),
                                   *(undefined1 (*) [64])(local_1b8.m_storage.m_data + lVar29));
          *(undefined1 (*) [64])
           (&((DenseStorage<double,__1,__1,_1,_0> *)local_198.m_storage.m_data)->m_data + lVar29) =
               auVar42;
          lVar29 = lVar29 + 8;
        } while (lVar29 < (long)uVar30);
      }
      if ((long)uVar30 < local_198.m_storage.m_rows) {
        do {
          (&((DenseStorage<double,__1,__1,_1,_0> *)local_198.m_storage.m_data)->m_data)[uVar30] =
               (double *)
               ((double)(&((DenseStorage<double,__1,__1,_1,_0> *)local_198.m_storage.m_data)->m_data
                        )[uVar30] - local_1b8.m_storage.m_data[uVar30]);
          uVar30 = uVar30 + 1;
        } while (local_198.m_storage.m_rows != uVar30);
      }
      local_98[0] = 0;
      local_98[1] = 0;
      (*sysd->_vptr_ChSystemDescriptor[0x10])(sysd,local_98,1);
      local_118._0_8_ = (pCVar26->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance;
      local_108._0_8_ = pCVar26->rel_tolerance;
      if (local_198.m_storage.m_rows == 0) {
        local_b8 = 0.0;
      }
      else {
        local_160.m_lhs = (LhsNested)&local_198;
        if (local_198.m_storage.m_rows < 1) {
          pcVar25 = 
          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
          ;
LAB_007ba29b:
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,pcVar25);
        }
        local_d8.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (plainobjectbase_evaluator_data<double,_0>)local_198.m_storage.m_data;
        local_b8 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)&local_e0,&local_1f1,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                               *)&local_160);
        pCVar26 = local_1f0;
      }
      if ((pCVar26->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == true) {
        (*sysd->_vptr_ChSystemDescriptor[0x12])(sysd,&local_1c8,1);
      }
      else {
        if (local_1c8.m_storage.m_rows < 0) goto LAB_007ba2f5;
        if (local_1c8.m_storage.m_rows != 0) {
          memset(local_1c8.m_storage.m_data,0,local_1c8.m_storage.m_rows << 3);
        }
      }
      (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&local_1d8,&local_1c8,0);
      if (local_198.m_storage.m_rows != local_1d8.m_storage.m_rows) {
LAB_007ba1a2:
        pcVar25 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
LAB_007ba238:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar25);
      }
      uVar30 = local_198.m_storage.m_rows + 7;
      if (-1 < local_198.m_storage.m_rows) {
        uVar30 = local_198.m_storage.m_rows;
      }
      uVar30 = uVar30 & 0xfffffffffffffff8;
      if (7 < local_198.m_storage.m_rows) {
        lVar29 = 0;
        do {
          auVar42 = vsubpd_avx512f(*(undefined1 (*) [64])
                                    (&((DenseStorage<double,__1,__1,_1,_0> *)
                                      local_198.m_storage.m_data)->m_data + lVar29),
                                   *(undefined1 (*) [64])
                                    (&((DenseStorage<double,__1,__1,_1,_0> *)
                                      local_1d8.m_storage.m_data)->m_data + lVar29));
          *(undefined1 (*) [64])
           (&((DenseStorage<double,__1,__1,_1,_0> *)local_1d8.m_storage.m_data)->m_data + lVar29) =
               auVar42;
          lVar29 = lVar29 + 8;
        } while (lVar29 < (long)uVar30);
      }
      uVar27 = local_198.m_storage.m_rows;
      if ((long)uVar30 < local_198.m_storage.m_rows) {
        do {
          (&((DenseStorage<double,__1,__1,_1,_0> *)local_1d8.m_storage.m_data)->m_data)[uVar30] =
               (double *)
               ((double)(&((DenseStorage<double,__1,__1,_1,_0> *)local_198.m_storage.m_data)->m_data
                        )[uVar30] -
               (double)(&((DenseStorage<double,__1,__1,_1,_0> *)local_1d8.m_storage.m_data)->m_data)
                       [uVar30]);
          uVar30 = uVar30 + 1;
          uVar27 = local_1d8.m_storage.m_rows;
        } while (local_198.m_storage.m_rows != uVar30);
      }
      if ((long)uVar27 < 0) {
LAB_007ba15e:
        pcVar25 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_007ba173;
      }
      if (local_1c8.m_storage.m_rows != uVar27) {
LAB_007ba1b9:
        pcVar25 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_007ba238;
      }
      dVar34 = local_1f0->grad_diffstep;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar34;
      uVar30 = uVar27 & 0x7ffffffffffffff8;
      if (7 < uVar27) {
        auVar42 = vbroadcastsd_avx512f(auVar31);
        uVar28 = 0;
        do {
          auVar33 = vmulpd_avx512f(auVar42,*(undefined1 (*) [64])
                                            (&((DenseStorage<double,__1,__1,_1,_0> *)
                                              local_1d8.m_storage.m_data)->m_data + uVar28));
          auVar33 = vaddpd_avx512f(auVar33,*(undefined1 (*) [64])
                                            (local_1c8.m_storage.m_data + uVar28));
          *(undefined1 (*) [64])
           (&((DenseStorage<double,__1,__1,_1,_0> *)local_1d8.m_storage.m_data)->m_data + uVar28) =
               auVar33;
          uVar28 = uVar28 + 8;
        } while (uVar28 < uVar30);
      }
      if ((long)uVar30 < (long)uVar27) {
        do {
          (&((DenseStorage<double,__1,__1,_1,_0> *)local_1d8.m_storage.m_data)->m_data)[uVar30] =
               (double *)
               (dVar34 * (double)(&((DenseStorage<double,__1,__1,_1,_0> *)local_1d8.m_storage.m_data
                                   )->m_data)[uVar30] + local_1c8.m_storage.m_data[uVar30]);
          uVar30 = uVar30 + 1;
        } while (uVar27 != uVar30);
      }
      (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd);
      pdVar14 = local_138.m_storage.m_data;
      IVar13 = local_1d8.m_storage.m_rows;
      pdVar2 = local_1d8.m_storage.m_data;
      if (local_1d8.m_storage.m_rows != local_1c8.m_storage.m_rows) goto LAB_007ba1a2;
      if (local_1d8.m_storage.m_rows < 0) goto LAB_007ba15e;
      uVar30 = local_1d8.m_storage.m_rows & 0x7ffffffffffffff8;
      dVar34 = local_1f0->grad_diffstep;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar34;
      if (7 < (ulong)local_1d8.m_storage.m_rows) {
        auVar42 = vbroadcastsd_avx512f(auVar37);
        uVar27 = 0;
        do {
          auVar33 = vsubpd_avx512f(*(undefined1 (*) [64])
                                    (&((DenseStorage<double,__1,__1,_1,_0> *)
                                      local_1d8.m_storage.m_data)->m_data + uVar27),
                                   *(undefined1 (*) [64])(local_1c8.m_storage.m_data + uVar27));
          auVar33 = vdivpd_avx512f(auVar33,auVar42);
          *(undefined1 (*) [64])
           (&((DenseStorage<double,__1,__1,_1,_0> *)local_1d8.m_storage.m_data)->m_data + uVar27) =
               auVar33;
          uVar27 = uVar27 + 8;
        } while (uVar27 < uVar30);
      }
      if ((long)uVar30 < local_1d8.m_storage.m_rows) {
        do {
          (&((DenseStorage<double,__1,__1,_1,_0> *)local_1d8.m_storage.m_data)->m_data)[uVar30] =
               (double *)
               (((double)(&((DenseStorage<double,__1,__1,_1,_0> *)local_1d8.m_storage.m_data)->
                           m_data)[uVar30] - local_1c8.m_storage.m_data[uVar30]) / dVar34);
          uVar30 = uVar30 + 1;
        } while (local_1d8.m_storage.m_rows != uVar30);
      }
      if ((local_1f0->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true) {
        if (local_1d8.m_storage.m_rows != local_138.m_storage.m_rows) {
LAB_007ba223:
          pcVar25 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_007ba238;
        }
        if ((local_1a8.m_storage.m_rows != local_1d8.m_storage.m_rows) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_1a8,local_1d8.m_storage.m_rows,1),
           local_1a8.m_storage.m_rows != IVar13)) {
LAB_007ba2a8:
          pcVar25 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
          ;
          goto LAB_007ba2eb;
        }
        uVar30 = IVar13 + 7;
        if (-1 < IVar13) {
          uVar30 = IVar13;
        }
        uVar30 = uVar30 & 0xfffffffffffffff8;
        if (7 < IVar13) {
          lVar29 = 0;
          do {
            auVar42 = vmulpd_avx512f(*(undefined1 (*) [64])
                                      (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data +
                                      lVar29),*(undefined1 (*) [64])(pdVar14 + lVar29));
            *(undefined1 (*) [64])(local_1a8.m_storage.m_data + lVar29) = auVar42;
            lVar29 = lVar29 + 8;
          } while (lVar29 < (long)uVar30);
        }
        if ((long)uVar30 < IVar13) {
          do {
            local_1a8.m_storage.m_data[uVar30] =
                 (double)(&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data)[uVar30] *
                 pdVar14[uVar30];
            uVar30 = uVar30 + 1;
          } while (IVar13 != uVar30);
        }
LAB_007b91b2:
        pdVar2 = local_1a8.m_storage.m_data;
        if ((local_1e8.m_storage.m_rows == IVar13) ||
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_1e8,IVar13,1), local_1e8.m_storage.m_rows == IVar13)) {
          uVar30 = IVar13 + 7;
          if (-1 < IVar13) {
            uVar30 = IVar13;
          }
          uVar30 = uVar30 & 0xfffffffffffffff8;
          if (7 < IVar13) {
            lVar29 = 0;
            do {
              *(undefined1 (*) [64])
               (&((DenseStorage<double,__1,__1,_1,_0> *)local_1e8.m_storage.m_data)->m_data + lVar29
               ) = *(undefined1 (*) [64])(pdVar2 + lVar29);
              lVar29 = lVar29 + 8;
            } while (lVar29 < (long)uVar30);
          }
          if ((long)uVar30 < IVar13) {
            do {
              (&((DenseStorage<double,__1,__1,_1,_0> *)local_1e8.m_storage.m_data)->m_data)[uVar30]
                   = (double *)pdVar2[uVar30];
              uVar30 = uVar30 + 1;
            } while (IVar13 != uVar30);
          }
          (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&local_188,&local_1e8,0);
          (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&local_148,&local_1a8,0);
          pCVar26 = local_1f0;
          if (0 < (local_1f0->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations) {
            uVar18 = 0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_118._0_8_;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = local_b8 * (double)local_108._0_8_;
            auVar31 = vmaxsd_avx(auVar38,auVar3);
            local_80 = auVar31._0_8_;
            local_58 = 0x7fffffffffffffff;
            uStack_50 = 0x7fffffffffffffff;
            do {
              pdVar14 = local_138.m_storage.m_data;
              uVar30 = local_148.m_storage.m_rows;
              pdVar2 = local_148.m_storage.m_data;
              if ((local_1f0->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond ==
                  true) {
                if (local_148.m_storage.m_rows != local_138.m_storage.m_rows) goto LAB_007ba223;
                if ((local_178.m_storage.m_rows != local_148.m_storage.m_rows) &&
                   (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                              (&local_178,local_148.m_storage.m_rows,1),
                   local_178.m_storage.m_rows != uVar30)) goto LAB_007ba2a8;
                uVar27 = uVar30 + 7;
                if (-1 < (long)uVar30) {
                  uVar27 = uVar30;
                }
                uVar27 = uVar27 & 0xfffffffffffffff8;
                if (7 < (long)uVar30) {
                  lVar29 = 0;
                  do {
                    auVar42 = vmulpd_avx512f(*(undefined1 (*) [64])
                                              (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->
                                                m_data + lVar29),
                                             *(undefined1 (*) [64])(pdVar14 + lVar29));
                    *(undefined1 (*) [64])
                     (&((DenseStorage<double,__1,__1,_1,_0> *)local_178.m_storage.m_data)->m_data +
                     lVar29) = auVar42;
                    lVar29 = lVar29 + 8;
                  } while (lVar29 < (long)uVar27);
                }
                if ((long)uVar27 < (long)uVar30) {
                  do {
                    (&((DenseStorage<double,__1,__1,_1,_0> *)local_178.m_storage.m_data)->m_data)
                    [uVar27] = (double *)
                               ((double)(&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data)
                                        [uVar27] * pdVar14[uVar27]);
                    uVar27 = uVar27 + 1;
                  } while (uVar30 != uVar27);
                }
              }
              else {
                if ((local_178.m_storage.m_rows != local_148.m_storage.m_rows) &&
                   (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                              (&local_178,local_148.m_storage.m_rows,1),
                   local_178.m_storage.m_rows != uVar30)) goto LAB_007ba209;
                uVar27 = uVar30 + 7;
                if (-1 < (long)uVar30) {
                  uVar27 = uVar30;
                }
                uVar27 = uVar27 & 0xfffffffffffffff8;
                if (7 < (long)uVar30) {
                  lVar29 = 0;
                  do {
                    *(undefined1 (*) [64])
                     (&((DenseStorage<double,__1,__1,_1,_0> *)local_178.m_storage.m_data)->m_data +
                     lVar29) = *(undefined1 (*) [64])
                                (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data + lVar29);
                    lVar29 = lVar29 + 8;
                  } while (lVar29 < (long)uVar27);
                }
                if ((long)uVar27 < (long)uVar30) {
                  do {
                    (&((DenseStorage<double,__1,__1,_1,_0> *)local_178.m_storage.m_data)->m_data)
                    [uVar27] = (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data)[uVar27];
                    uVar27 = uVar27 + 1;
                  } while (uVar30 != uVar27);
                }
              }
              if (local_1e8.m_storage.m_rows != local_188.m_storage.m_rows) goto LAB_007ba180;
              local_160.m_lhs = (LhsNested)&local_1e8;
              local_160.m_rhs = (RhsNested)&local_188;
              if (local_1e8.m_storage.m_rows != 0) {
                if (0 < local_1e8.m_storage.m_rows) {
                  local_d8.m_d.data =
                       (plainobjectbase_evaluator_data<double,_0>)
                       (plainobjectbase_evaluator_data<double,_0>)local_1e8.m_storage.m_data;
                  local_d0.m_d.data =
                       (plainobjectbase_evaluator_data<double,_0>)
                       (plainobjectbase_evaluator_data<double,_0>)local_188.m_storage.m_data;
                  SVar35 = Eigen::internal::
                           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                           ::
                           run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                     ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_e0,(scalar_sum_op<double,_double> *)&local_1f1,
                                      &local_160);
                  local_118._0_8_ = SVar35;
                  uVar30 = local_178.m_storage.m_rows;
                  goto LAB_007b947e;
                }
LAB_007ba1d0:
                pcVar25 = 
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                ;
                goto LAB_007ba29b;
              }
              auVar12._8_8_ = 0;
              auVar12._0_8_ = local_118._8_8_;
              local_118 = auVar12 << 0x40;
LAB_007b947e:
              if (uVar30 != local_148.m_storage.m_rows) goto LAB_007ba180;
              local_160.m_lhs = (LhsNested)&local_178;
              local_160.m_rhs = (RhsNested)&local_148;
              if (uVar30 == 0) {
                auVar31 = ZEXT816(0) << 0x40;
              }
              else {
                if ((long)uVar30 < 1) goto LAB_007ba1d0;
                local_d8.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)local_178.m_storage.m_data;
                local_d0.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)local_148.m_storage.m_data;
                auVar42._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&local_e0,(scalar_sum_op<double,_double> *)&local_1f1,&local_160)
                ;
                auVar42._8_56_ = extraout_var;
                auVar31 = auVar42._0_16_;
              }
              auVar9._8_8_ = 0x7fffffffffffffff;
              auVar9._0_8_ = 0x7fffffffffffffff;
              auVar32 = vandpd_avx512vl(auVar31,auVar9);
              if (1e-29 <= auVar32._0_8_) {
                uVar36 = auVar31._0_8_;
              }
              else {
                uVar36 = 0x3da5fd7fe1796495;
                local_108 = auVar31;
                if ((local_1f0->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose
                    == true) {
                  pCVar19 = GetLog();
                  pCVar20 = ChStreamOutAscii::operator<<(&pCVar19->super_ChStreamOutAscii,"Iter=");
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,uVar18);
                  pCVar20 = ChStreamOutAscii::operator<<
                                      (pCVar20," Rayleigh quotient alpha breakdown: ");
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,(double)local_118._0_8_);
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20," / ");
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,(double)local_108._0_8_);
                  ChStreamOutAscii::operator<<(pCVar20,"\n");
                  uVar36 = 0x3da5fd7fe1796495;
                }
              }
              IVar13 = local_1a8.m_storage.m_rows;
              pdVar2 = local_1a8.m_storage.m_data;
              if (local_1a8.m_storage.m_rows < 0) goto LAB_007ba15e;
              local_108._0_8_ = uVar36;
              if ((local_1b8.m_storage.m_rows != local_1a8.m_storage.m_rows) &&
                 (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                            (&local_1b8,local_1a8.m_storage.m_rows,1),
                 local_1b8.m_storage.m_rows != IVar13)) {
                pcVar25 = 
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
                ;
                goto LAB_007ba2eb;
              }
              uVar30 = IVar13 & 0x7ffffffffffffff8;
              auVar39._0_8_ = (double)local_118._0_8_ / (double)local_108._0_8_;
              auVar39._8_8_ = 0;
              if (7 < (ulong)IVar13) {
                auVar42 = vbroadcastsd_avx512f(auVar39);
                uVar27 = 0;
                do {
                  auVar33 = vmulpd_avx512f(auVar42,*(undefined1 (*) [64])(pdVar2 + uVar27));
                  *(undefined1 (*) [64])(local_1b8.m_storage.m_data + uVar27) = auVar33;
                  uVar27 = uVar27 + 8;
                } while (uVar27 < uVar30);
              }
              if ((long)uVar30 < IVar13) {
                do {
                  local_1b8.m_storage.m_data[uVar30] = auVar39._0_8_ * pdVar2[uVar30];
                  uVar30 = uVar30 + 1;
                } while (IVar13 != uVar30);
              }
              if (local_1c8.m_storage.m_rows != IVar13) {
                pcVar25 = 
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                ;
                goto LAB_007ba25a;
              }
              uVar30 = IVar13 & 0x7ffffffffffffff8;
              if (7 < IVar13) {
                uVar27 = 0;
                do {
                  auVar42 = vaddpd_avx512f(*(undefined1 (*) [64])
                                            (local_1b8.m_storage.m_data + uVar27),
                                           *(undefined1 (*) [64])
                                            (local_1c8.m_storage.m_data + uVar27));
                  *(undefined1 (*) [64])(local_1c8.m_storage.m_data + uVar27) = auVar42;
                  uVar27 = uVar27 + 8;
                } while (uVar27 < uVar30);
              }
              if ((long)uVar30 < IVar13) {
                do {
                  local_1c8.m_storage.m_data[uVar30] =
                       local_1b8.m_storage.m_data[uVar30] + local_1c8.m_storage.m_data[uVar30];
                  uVar30 = uVar30 + 1;
                } while (IVar13 != uVar30);
LAB_007b96ce:
                local_160.m_lhs = (LhsNested)&local_1b8;
                local_d8.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)local_1b8.m_storage.m_data;
                local_a0 = Eigen::internal::
                           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                           ::
                           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_e0,(scalar_sum_op<double,_double> *)&local_1f1,
                                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       *)&local_160);
              }
              else {
                local_160.m_lhs = (LhsNested)&local_1b8;
                if (IVar13 != 0) goto LAB_007b96ce;
                local_a0 = 0.0;
              }
              (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd,&local_1c8);
              (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&local_1d8,&local_1c8,0);
              if (local_198.m_storage.m_rows != local_1d8.m_storage.m_rows) goto LAB_007ba1a2;
              uVar30 = local_198.m_storage.m_rows + 7;
              if (-1 < local_198.m_storage.m_rows) {
                uVar30 = local_198.m_storage.m_rows;
              }
              uVar30 = uVar30 & 0xfffffffffffffff8;
              if (7 < local_198.m_storage.m_rows) {
                lVar29 = 0;
                do {
                  auVar42 = vsubpd_avx512f(*(undefined1 (*) [64])
                                            (&((DenseStorage<double,__1,__1,_1,_0> *)
                                              local_198.m_storage.m_data)->m_data + lVar29),
                                           *(undefined1 (*) [64])
                                            (&((DenseStorage<double,__1,__1,_1,_0> *)
                                              local_1d8.m_storage.m_data)->m_data + lVar29));
                  *(undefined1 (*) [64])
                   (&((DenseStorage<double,__1,__1,_1,_0> *)local_1d8.m_storage.m_data)->m_data +
                   lVar29) = auVar42;
                  lVar29 = lVar29 + 8;
                } while (lVar29 < (long)uVar30);
              }
              uVar27 = local_198.m_storage.m_rows;
              if ((long)uVar30 < local_198.m_storage.m_rows) {
                do {
                  (&((DenseStorage<double,__1,__1,_1,_0> *)local_1d8.m_storage.m_data)->m_data)
                  [uVar30] = (double *)
                             ((double)(&((DenseStorage<double,__1,__1,_1,_0> *)
                                        local_198.m_storage.m_data)->m_data)[uVar30] -
                             (double)(&((DenseStorage<double,__1,__1,_1,_0> *)
                                       local_1d8.m_storage.m_data)->m_data)[uVar30]);
                  uVar30 = uVar30 + 1;
                  uVar27 = local_1d8.m_storage.m_rows;
                } while (local_198.m_storage.m_rows != uVar30);
              }
              if ((long)uVar27 < 0) goto LAB_007ba15e;
              if (local_1c8.m_storage.m_rows != uVar27) goto LAB_007ba1b9;
              uVar30 = uVar27 & 0x7ffffffffffffff8;
              dVar34 = local_1f0->grad_diffstep;
              auVar40._8_8_ = 0;
              auVar40._0_8_ = dVar34;
              if (7 < uVar27) {
                auVar42 = vbroadcastsd_avx512f(auVar40);
                uVar28 = 0;
                do {
                  auVar33 = vmulpd_avx512f(auVar42,*(undefined1 (*) [64])
                                                    (&((DenseStorage<double,__1,__1,_1,_0> *)
                                                      local_1d8.m_storage.m_data)->m_data + uVar28))
                  ;
                  auVar33 = vaddpd_avx512f(auVar33,*(undefined1 (*) [64])
                                                    (local_1c8.m_storage.m_data + uVar28));
                  *(undefined1 (*) [64])
                   (&((DenseStorage<double,__1,__1,_1,_0> *)local_1d8.m_storage.m_data)->m_data +
                   uVar28) = auVar33;
                  uVar28 = uVar28 + 8;
                } while (uVar28 < uVar30);
              }
              if ((long)uVar30 < (long)uVar27) {
                do {
                  (&((DenseStorage<double,__1,__1,_1,_0> *)local_1d8.m_storage.m_data)->m_data)
                  [uVar30] = (double *)
                             (dVar34 * (double)(&((DenseStorage<double,__1,__1,_1,_0> *)
                                                 local_1d8.m_storage.m_data)->m_data)[uVar30] +
                             local_1c8.m_storage.m_data[uVar30]);
                  uVar30 = uVar30 + 1;
                } while (uVar27 != uVar30);
              }
              (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd,&local_1d8);
              if (local_1d8.m_storage.m_rows != local_1c8.m_storage.m_rows) goto LAB_007ba1a2;
              if (local_1d8.m_storage.m_rows < 0) goto LAB_007ba15e;
              uVar30 = local_1d8.m_storage.m_rows & 0x7ffffffffffffff8;
              dVar34 = local_1f0->grad_diffstep;
              auVar41._8_8_ = 0;
              auVar41._0_8_ = dVar34;
              if (7 < (ulong)local_1d8.m_storage.m_rows) {
                auVar42 = vbroadcastsd_avx512f(auVar41);
                uVar27 = 0;
                do {
                  auVar33 = vsubpd_avx512f(*(undefined1 (*) [64])
                                            (local_1d8.m_storage.m_data + uVar27),
                                           *(undefined1 (*) [64])
                                            (local_1c8.m_storage.m_data + uVar27));
                  auVar33 = vdivpd_avx512f(auVar33,auVar42);
                  *(undefined1 (*) [64])(local_1d8.m_storage.m_data + uVar27) = auVar33;
                  uVar27 = uVar27 + 8;
                } while (uVar27 < uVar30);
              }
              if ((long)uVar30 < local_1d8.m_storage.m_rows) {
                do {
                  local_1d8.m_storage.m_data[uVar30] =
                       (local_1d8.m_storage.m_data[uVar30] - local_1c8.m_storage.m_data[uVar30]) /
                       dVar34;
                  uVar30 = uVar30 + 1;
                } while (local_1d8.m_storage.m_rows != uVar30);
              }
              piVar1 = &(local_1f0->super_ChIterativeSolverVI).m_iterations;
              *piVar1 = *piVar1 + 1;
              local_160.m_lhs = (LhsNested)&local_1d8;
              if (local_1d8.m_storage.m_rows == 0) {
                auVar31 = ZEXT816(0);
              }
              else {
                if (local_1d8.m_storage.m_rows < 1) {
                  pcVar25 = 
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                  ;
                  goto LAB_007ba29b;
                }
                local_d8.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)local_1d8.m_storage.m_data;
                auVar33._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&local_e0,(scalar_sum_op<double,_double> *)&local_1f1,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                 *)&local_160);
                auVar33._8_56_ = extraout_var_00;
                auVar31 = auVar33._0_16_;
              }
              IVar13 = local_1e8.m_storage.m_rows;
              pdVar2 = local_1e8.m_storage.m_data;
              pCVar26 = local_1f0;
              auVar31 = vsqrtsd_avx(auVar31,auVar31);
              local_1f0->r_proj_resid = auVar31._0_8_;
              if (auVar31._0_8_ < local_80) {
                if ((local_1f0->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose
                    == true) {
                  pCVar19 = GetLog();
                  pCVar20 = ChStreamOutAscii::operator<<(&pCVar19->super_ChStreamOutAscii,"Iter=");
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,uVar18);
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20," P(r)-converged!  |P(r)|=");
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,pCVar26->r_proj_resid);
                  ChStreamOutAscii::operator<<(pCVar20,"\n");
                }
                break;
              }
              if ((local_f8.m_storage.m_rows != local_1e8.m_storage.m_rows) &&
                 (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                            (&local_f8,local_1e8.m_storage.m_rows,1),
                 local_f8.m_storage.m_rows != IVar13)) goto LAB_007ba209;
              pdVar16 = local_138.m_storage.m_data;
              IVar15 = local_1d8.m_storage.m_rows;
              pdVar14 = local_1d8.m_storage.m_data;
              uVar30 = IVar13 + 7;
              if (-1 < IVar13) {
                uVar30 = IVar13;
              }
              uVar30 = uVar30 & 0xfffffffffffffff8;
              if (7 < IVar13) {
                lVar29 = 0;
                do {
                  *(undefined1 (*) [64])
                   (&((DenseStorage<double,__1,__1,_1,_0> *)local_f8.m_storage.m_data)->m_data +
                   lVar29) = *(undefined1 (*) [64])
                              (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data + lVar29);
                  lVar29 = lVar29 + 8;
                } while (lVar29 < (long)uVar30);
              }
              if ((long)uVar30 < IVar13) {
                do {
                  (&((DenseStorage<double,__1,__1,_1,_0> *)local_f8.m_storage.m_data)->m_data)
                  [uVar30] = (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data)[uVar30];
                  uVar30 = uVar30 + 1;
                } while (IVar13 != uVar30);
              }
              if ((local_1f0->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond ==
                  true) {
                if (local_1d8.m_storage.m_rows != local_138.m_storage.m_rows) goto LAB_007ba223;
                if ((local_1e8.m_storage.m_rows != local_1d8.m_storage.m_rows) &&
                   (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                              (&local_1e8,local_1d8.m_storage.m_rows,1),
                   local_1e8.m_storage.m_rows != IVar15)) goto LAB_007ba2a8;
                uVar30 = IVar15 + 7;
                if (-1 < IVar15) {
                  uVar30 = IVar15;
                }
                uVar30 = uVar30 & 0xfffffffffffffff8;
                if (7 < IVar15) {
                  lVar29 = 0;
                  do {
                    auVar42 = vmulpd_avx512f(*(undefined1 (*) [64])
                                              (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar14)->
                                                m_data + lVar29),
                                             *(undefined1 (*) [64])(pdVar16 + lVar29));
                    *(undefined1 (*) [64])
                     (&((DenseStorage<double,__1,__1,_1,_0> *)local_1e8.m_storage.m_data)->m_data +
                     lVar29) = auVar42;
                    lVar29 = lVar29 + 8;
                  } while (lVar29 < (long)uVar30);
                }
                if ((long)uVar30 < IVar15) {
                  do {
                    (&((DenseStorage<double,__1,__1,_1,_0> *)local_1e8.m_storage.m_data)->m_data)
                    [uVar30] = (double *)
                               ((double)(&((DenseStorage<double,__1,__1,_1,_0> *)pdVar14)->m_data)
                                        [uVar30] * pdVar16[uVar30]);
                    uVar30 = uVar30 + 1;
                  } while (IVar15 != uVar30);
                }
              }
              else {
                if ((local_1e8.m_storage.m_rows != local_1d8.m_storage.m_rows) &&
                   (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                              (&local_1e8,local_1d8.m_storage.m_rows,1),
                   local_1e8.m_storage.m_rows != IVar15)) goto LAB_007ba209;
                uVar30 = IVar15 + 7;
                if (-1 < IVar15) {
                  uVar30 = IVar15;
                }
                uVar30 = uVar30 & 0xfffffffffffffff8;
                if (7 < IVar15) {
                  lVar29 = 0;
                  do {
                    *(undefined1 (*) [64])
                     (&((DenseStorage<double,__1,__1,_1,_0> *)local_1e8.m_storage.m_data)->m_data +
                     lVar29) = *(undefined1 (*) [64])
                                (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar14)->m_data + lVar29);
                    lVar29 = lVar29 + 8;
                  } while (lVar29 < (long)uVar30);
                }
                if ((long)uVar30 < IVar15) {
                  do {
                    (&((DenseStorage<double,__1,__1,_1,_0> *)local_1e8.m_storage.m_data)->m_data)
                    [uVar30] = (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar14)->m_data)[uVar30];
                    uVar30 = uVar30 + 1;
                  } while (IVar15 != uVar30);
                }
              }
              IVar13 = local_188.m_storage.m_rows;
              pdVar2 = local_188.m_storage.m_data;
              if ((local_128.m_storage.m_rows != local_188.m_storage.m_rows) &&
                 (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                            (&local_128,local_188.m_storage.m_rows,1),
                 local_128.m_storage.m_rows != IVar13)) goto LAB_007ba209;
              uVar30 = IVar13 + 7;
              if (-1 < IVar13) {
                uVar30 = IVar13;
              }
              uVar30 = uVar30 & 0xfffffffffffffff8;
              if (7 < IVar13) {
                lVar29 = 0;
                do {
                  *(undefined1 (*) [64])
                   (&((DenseStorage<double,__1,__1,_1,_0> *)local_128.m_storage.m_data)->m_data +
                   lVar29) = *(undefined1 (*) [64])
                              (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data + lVar29);
                  lVar29 = lVar29 + 8;
                } while (lVar29 < (long)uVar30);
              }
              if ((long)uVar30 < IVar13) {
                do {
                  (&((DenseStorage<double,__1,__1,_1,_0> *)local_128.m_storage.m_data)->m_data)
                  [uVar30] = (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data)[uVar30];
                  uVar30 = uVar30 + 1;
                } while (IVar13 != uVar30);
              }
              (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,&local_188,&local_1e8,0);
              pdVar14 = local_128.m_storage.m_data;
              IVar13 = local_188.m_storage.m_rows;
              pdVar2 = local_188.m_storage.m_data;
              if (local_188.m_storage.m_rows != local_128.m_storage.m_rows) goto LAB_007ba1a2;
              if ((local_1b8.m_storage.m_rows != local_188.m_storage.m_rows) &&
                 (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                            (&local_1b8,local_188.m_storage.m_rows,1),
                 local_1b8.m_storage.m_rows != IVar13)) {
                pcVar25 = 
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
                ;
                goto LAB_007ba2eb;
              }
              uVar30 = IVar13 + 7;
              if (-1 < IVar13) {
                uVar30 = IVar13;
              }
              uVar30 = uVar30 & 0xfffffffffffffff8;
              if (7 < IVar13) {
                lVar29 = 0;
                do {
                  auVar42 = vsubpd_avx512f(*(undefined1 (*) [64])
                                            (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data
                                            + lVar29),
                                           *(undefined1 (*) [64])
                                            (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar14)->
                                              m_data + lVar29));
                  *(undefined1 (*) [64])(local_1b8.m_storage.m_data + lVar29) = auVar42;
                  lVar29 = lVar29 + 8;
                } while (lVar29 < (long)uVar30);
              }
              if ((long)uVar30 < IVar13) {
                do {
                  local_1b8.m_storage.m_data[uVar30] =
                       (double)(&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data)[uVar30] -
                       (double)(&((DenseStorage<double,__1,__1,_1,_0> *)pdVar14)->m_data)[uVar30];
                  uVar30 = uVar30 + 1;
                } while (IVar13 != uVar30);
              }
              if (local_1e8.m_storage.m_rows != IVar13) goto LAB_007ba180;
              local_160.m_lhs = (LhsNested)&local_1e8;
              local_160.m_rhs = (RhsNested)&local_1b8;
              if (IVar13 == 0) {
                local_108 = ZEXT816(0);
              }
              else {
                if (IVar13 < 1) goto LAB_007ba1d0;
                local_d8.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)local_1e8.m_storage.m_data;
                local_d0.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)local_1b8.m_storage.m_data;
                local_108._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&local_e0,(scalar_sum_op<double,_double> *)&local_1f1,&local_160)
                ;
                local_108._8_8_ = extraout_XMM0_Qb;
              }
              if (local_f8.m_storage.m_rows != local_128.m_storage.m_rows) {
LAB_007ba180:
                __assert_fail("size() == other.size()","/usr/include/eigen3/Eigen/src/Core/Dot.h",
                              0x52,
                              "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                             );
              }
              local_160.m_lhs = (LhsNested)&local_f8;
              local_160.m_rhs = (RhsNested)&local_128;
              if (local_f8.m_storage.m_rows == 0) {
                local_b8 = 0.0;
                uStack_b0 = 0;
              }
              else {
                if (local_f8.m_storage.m_rows < 1) goto LAB_007ba1d0;
                local_d8.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)local_f8.m_storage.m_data;
                local_d0.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)local_128.m_storage.m_data;
                local_b8 = Eigen::internal::
                           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                           ::
                           run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                     ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_e0,(scalar_sum_op<double,_double> *)&local_1f1,
                                      &local_160);
                uStack_b0 = extraout_XMM0_Qb_00;
              }
              auVar11._8_8_ = uStack_50;
              auVar11._0_8_ = local_58;
              auVar31 = vandpd_avx(auVar11,local_108);
              if ((auVar31._0_8_ < 1e-29) ||
                 (auVar10._8_8_ = uStack_b0, auVar10._0_8_ = local_b8,
                 auVar31 = vandpd_avx(auVar11,auVar10), auVar31._0_8_ < 1e-29)) {
                local_118 = ZEXT816(0);
                if ((local_1f0->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose
                    == true) {
                  pCVar19 = GetLog();
                  pCVar20 = ChStreamOutAscii::operator<<(&pCVar19->super_ChStreamOutAscii,"Iter=");
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,uVar18);
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20," Ribiere quotient beta restart: ")
                  ;
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,(double)local_108._0_8_);
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20," / ");
                  pCVar20 = ChStreamOutAscii::operator<<(pCVar20,local_b8);
                  ChStreamOutAscii::operator<<(pCVar20,"\n");
                }
              }
              else {
                local_118._0_8_ = (double)local_108._0_8_ / local_b8;
                local_118._8_8_ = local_108._8_8_;
              }
              if (local_1a8.m_storage.m_rows < 0) goto LAB_007ba15e;
              if (local_1e8.m_storage.m_rows != local_1a8.m_storage.m_rows) goto LAB_007ba1b9;
              uVar30 = local_1a8.m_storage.m_rows & 0x7ffffffffffffff8;
              if (7 < (ulong)local_1a8.m_storage.m_rows) {
                auVar4._8_8_ = 0;
                auVar4._0_8_ = local_118._0_8_;
                auVar42 = vbroadcastsd_avx512f(auVar4);
                uVar27 = 0;
                do {
                  auVar33 = vmulpd_avx512f(auVar42,*(undefined1 (*) [64])
                                                    (local_1a8.m_storage.m_data + uVar27));
                  auVar33 = vaddpd_avx512f(auVar33,*(undefined1 (*) [64])
                                                    (&((DenseStorage<double,__1,__1,_1,_0> *)
                                                      local_1e8.m_storage.m_data)->m_data + uVar27))
                  ;
                  *(undefined1 (*) [64])(local_1a8.m_storage.m_data + uVar27) = auVar33;
                  uVar27 = uVar27 + 8;
                } while (uVar27 < uVar30);
              }
              if ((long)uVar30 < local_1a8.m_storage.m_rows) {
                do {
                  local_1a8.m_storage.m_data[uVar30] =
                       (double)local_118._0_8_ * local_1a8.m_storage.m_data[uVar30] +
                       (double)(&((DenseStorage<double,__1,__1,_1,_0> *)local_1e8.m_storage.m_data)
                                 ->m_data)[uVar30];
                  uVar30 = uVar30 + 1;
                } while (local_1a8.m_storage.m_rows != uVar30);
              }
              if (local_148.m_storage.m_rows < 0) goto LAB_007ba15e;
              if (local_188.m_storage.m_rows != local_148.m_storage.m_rows) goto LAB_007ba1b9;
              uVar30 = local_148.m_storage.m_rows & 0x7ffffffffffffff8;
              if (7 < (ulong)local_148.m_storage.m_rows) {
                auVar5._8_8_ = 0;
                auVar5._0_8_ = local_118._0_8_;
                auVar42 = vbroadcastsd_avx512f(auVar5);
                uVar27 = 0;
                do {
                  auVar33 = vmulpd_avx512f(auVar42,*(undefined1 (*) [64])
                                                    (&((DenseStorage<double,__1,__1,_1,_0> *)
                                                      local_148.m_storage.m_data)->m_data + uVar27))
                  ;
                  auVar33 = vaddpd_avx512f(auVar33,*(undefined1 (*) [64])
                                                    (&((DenseStorage<double,__1,__1,_1,_0> *)
                                                      local_188.m_storage.m_data)->m_data + uVar27))
                  ;
                  *(undefined1 (*) [64])
                   (&((DenseStorage<double,__1,__1,_1,_0> *)local_148.m_storage.m_data)->m_data +
                   uVar27) = auVar33;
                  uVar27 = uVar27 + 8;
                } while (uVar27 < uVar30);
              }
              if ((long)uVar30 < local_148.m_storage.m_rows) {
                do {
                  (&((DenseStorage<double,__1,__1,_1,_0> *)local_148.m_storage.m_data)->m_data)
                  [uVar30] = (double *)
                             ((double)local_118._0_8_ *
                              (double)(&((DenseStorage<double,__1,__1,_1,_0> *)
                                        local_148.m_storage.m_data)->m_data)[uVar30] +
                             (double)(&((DenseStorage<double,__1,__1,_1,_0> *)
                                       local_188.m_storage.m_data)->m_data)[uVar30]);
                  uVar30 = uVar30 + 1;
                } while (local_148.m_storage.m_rows != uVar30);
              }
              if ((local_1f0->super_ChIterativeSolverVI).record_violation_history == true) {
                auVar6._8_8_ = 0;
                auVar6._0_8_ = local_a0;
                auVar31 = vsqrtsd_avx(in_XMM3,auVar6);
                ChIterativeSolverVI::AtIterationEnd
                          (&local_1f0->super_ChIterativeSolverVI,local_1f0->r_proj_resid,
                           auVar31._0_8_,uVar18);
              }
              uVar18 = uVar18 + 1;
              pCVar26 = local_1f0;
            } while ((int)uVar18 <
                     (local_1f0->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations
                    );
          }
          (*sysd->_vptr_ChSystemDescriptor[0x13])(sysd,&local_1c8);
          (*sysd->_vptr_ChSystemDescriptor[0x11])(sysd,local_98);
          ppCVar22 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppCVar24 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if (ppCVar24 != ppCVar22) {
            uVar30 = 0;
            uVar27 = 1;
            do {
              pCVar7 = ppCVar22[uVar30];
              if (pCVar7->active == true) {
                (*pCVar7->_vptr_ChConstraint[8])(pCVar7->l_i);
                ppCVar22 = (sysd->vconstraints).
                           super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppCVar24 = (sysd->vconstraints).
                           super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              }
              bVar8 = uVar27 < (ulong)((long)ppCVar24 - (long)ppCVar22 >> 3);
              uVar30 = uVar27;
              uVar27 = (ulong)((int)uVar27 + 1);
            } while (bVar8);
          }
          if ((pCVar26->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose != false)
          {
            pCVar19 = GetLog();
            ChStreamOutAscii::operator<<(&pCVar19->super_ChStreamOutAscii,"-----\n");
          }
          local_1f0 = (ChSolverPMINRES *)pCVar26->r_proj_resid;
          if (local_98[0] != 0) {
            free(*(void **)(local_98[0] + -8));
          }
          if (local_138.m_storage.m_data != (double *)0x0) {
            free((void *)local_138.m_storage.m_data[-1]);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1b8.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_1b8.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_128.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_128.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_188.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_188.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_178.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_178.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_148.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_148.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_f8.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_f8.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1e8.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_1e8.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1d8.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_1d8.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if (local_1a8.m_storage.m_data != (double *)0x0) {
            free((void *)local_1a8.m_storage.m_data[-1]);
          }
          if ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_198.m_storage.m_data
              != (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0) {
            free((void *)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          ((long)local_198.m_storage.m_data + -0x10))->m_storage).m_rows);
          }
          if (local_1c8.m_storage.m_data != (double *)0x0) {
            free((void *)local_1c8.m_storage.m_data[-1]);
          }
          return (double)local_1f0;
        }
      }
      else if ((local_1a8.m_storage.m_rows == local_1d8.m_storage.m_rows) ||
              (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                         (&local_1a8,local_1d8.m_storage.m_rows,1),
              local_1a8.m_storage.m_rows == IVar13)) {
        uVar30 = IVar13 + 7;
        if (-1 < IVar13) {
          uVar30 = IVar13;
        }
        uVar30 = uVar30 & 0xfffffffffffffff8;
        if (7 < IVar13) {
          lVar29 = 0;
          do {
            *(undefined1 (*) [64])(local_1a8.m_storage.m_data + lVar29) =
                 *(undefined1 (*) [64])
                  (&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data + lVar29);
            lVar29 = lVar29 + 8;
          } while (lVar29 < (long)uVar30);
        }
        if ((long)uVar30 < IVar13) {
          do {
            local_1a8.m_storage.m_data[uVar30] =
                 (double)(&((DenseStorage<double,__1,__1,_1,_0> *)pdVar2)->m_data)[uVar30];
            uVar30 = uVar30 + 1;
          } while (IVar13 != uVar30);
        }
        goto LAB_007b91b2;
      }
LAB_007ba209:
      pcVar25 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
LAB_007ba2eb:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar25);
    }
  }
LAB_007ba2f5:
  pcVar25 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_007ba173:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar25);
}

Assistant:

double ChSolverPMINRES::Solve(ChSystemDescriptor& sysd) {
    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();

    // If stiffness blocks are used, the Schur complement cannot be esily
    // used, so fall back to the Solve_SupportingStiffness method, that operates on KKT.
    if (sysd.GetKblocksList().size() > 0)
        return this->Solve_SupportingStiffness(sysd);

    // Allocate auxiliary vectors;

    int nc = sysd.CountActiveConstraints();
    if (verbose)
        GetLog() << "\n-----Projected MINRES, solving nc=" << nc << "unknowns \n";

    ChVectorDynamic<> ml(nc);
    ChVectorDynamic<> mb(nc);
    ChVectorDynamic<> mp(nc);
    ChVectorDynamic<> mr(nc);
    ChVectorDynamic<> mz(nc);
    ChVectorDynamic<> mz_old(nc);
    ChVectorDynamic<> mNp(nc);
    ChVectorDynamic<> mMNp(nc);
    ChVectorDynamic<> mNMr(nc);
    ChVectorDynamic<> mNMr_old(nc);
    ChVectorDynamic<> mtmp(nc);
    ChVectorDynamic<> mDi(nc);

    m_iterations = 0;

    // Update auxiliary data in all constraints before starting,
    // that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        mconstraints[ic]->Update_auxiliary();

    // Average all g_i for the triplet of contact constraints n,u,v.
    //  Can be used as diagonal preconditioner.
    int j_friction_comp = 0;
    double gi_values[3];
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
            gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
            j_friction_comp++;
            if (j_friction_comp == 3) {
                double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                mconstraints[ic - 2]->Set_g_i(average_g_i);
                mconstraints[ic - 1]->Set_g_i(average_g_i);
                mconstraints[ic - 0]->Set_g_i(average_g_i);
                j_friction_comp = 0;
            }
        }
    }

    // The vector with the inverse of diagonal of the N matrix
    mDi.setZero();
    int d_i = 0;
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        if (mconstraints[ic]->IsActive()) {
            mDi(d_i, 0) = 1.0 / mconstraints[ic]->Get_g_i();
            ++d_i;
        }

    // ***TO DO*** move the following thirty lines in a short function ChSystemDescriptor::ShurBvectorCompute() ?

    // Compute the b_shur vector in the Shur complement equation N*l = b_shur
    // with
    //   N_shur  = D'* (M^-1) * D
    //   b_shur  = - c + D'*(M^-1)*k = b_i + D'*(M^-1)*k
    // but flipping the sign of lambdas,  b_shur = - b_i - D'*(M^-1)*k
    // Do this in three steps:

    // Put (M^-1)*k    in  q  sparse vector of each variable..
    for (unsigned int iv = 0; iv < mvariables.size(); iv++)
        if (mvariables[iv]->IsActive())
            mvariables[iv]->Compute_invMb_v(mvariables[iv]->Get_qb(), mvariables[iv]->Get_fb());  // q = [M]'*fb

    // ...and now do  b_shur = - D' * q  ..
    mb.setZero();
    int s_i = 0;
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        if (mconstraints[ic]->IsActive()) {
            mb(s_i, 0) = -mconstraints[ic]->Compute_Cq_q();
            ++s_i;
        }

    // ..and finally do   b_shur = b_shur - c
    sysd.BuildBiVector(mtmp);  // b_i   =   -c   = phi/h
    mb -= mtmp;

    // Optimization: backup the  q  sparse data computed above,
    // because   (M^-1)*k   will be needed at the end when computing primals.
    ChVectorDynamic<> mq;
    sysd.FromVariablesToVector(mq, true);

    double rel_tol = this->rel_tolerance;
    double abs_tol = m_tolerance;
    double rel_tol_b = mb.lpNorm<Eigen::Infinity>() * rel_tol;

    // Initialize lambdas
    if (m_warm_start)
        sysd.FromConstraintsToVector(ml);
    else
        ml.setZero();

    // Initial projection of ml   ***TO DO***?
    // ...

    // r = b - N*l;
    sysd.ShurComplementProduct(mr, ml);  // r = N*l
    mr = mb - mr;                        // r =-N*l+b

    // r = (project_orthogonal(l+diff*r, fric) - l)/diff;
    mr = ml + grad_diffstep * mr;    // r = l + diff*r
    sysd.ConstraintsProject(mr);     // r = P(l + diff*r) ...
    mr = (mr - ml) / grad_diffstep;  // r = (P(l + diff*r) - l)/diff

    // p = Mi * r;
    if (m_use_precond)
        mp = mr.array() * mDi.array();
    else
        mp = mr;

    // z = Mi * r;
    mz = mp;

    // NMr = N*M*r = N*z
    sysd.ShurComplementProduct(mNMr, mz);  // NMr = N*z

    // Np = N*p
    sysd.ShurComplementProduct(mNp, mp);  // Np = N*p

    //// RADU
    //// Is the above correct?  We always have z=p and therefore NMr = Np...

    //
    // THE LOOP
    //

    std::vector<double> f_hist;

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // MNp = Mi*Np; % = Mi*N*p                  %% -- Precond
        if (m_use_precond)
            mMNp = mNp.array() * mDi.array();
        else
            mMNp = mNp;

        // alpha = (z'*(NMr))/((MNp)'*(Np));
        double zNMr = mz.dot(mNMr);    // zMNr = z'* NMr
        double MNpNp = mMNp.dot(mNp);  //  MNpNp = ((MNp)'*(Np))

        if (fabs(MNpNp) < 10e-30) {
            if (verbose)
                GetLog() << "Iter=" << iter << " Rayleigh quotient alpha breakdown: " << zNMr << " / " << MNpNp << "\n";
            MNpNp = 10e-12;
        }

        double alpha = zNMr / MNpNp;  // alpha = (z'*(NMr))/((MNp)'*(Np));

        // l = l + alpha * p;
        mtmp = alpha * mp;
        ml += mtmp;

        double maxdeltalambda = mtmp.norm();  //***better infinity norm for speed reasons?

        // l = Proj(l)
        sysd.ConstraintsProject(ml);  // l = P(l)

        // r = b - N*l;
        sysd.ShurComplementProduct(mr, ml);  // r = N*l
        mr = mb - mr;                        // r =-N*l+b

        // r = (project_orthogonal(l+diff*r, fric) - l)/diff;
        mr = ml + grad_diffstep * mr;
        sysd.ConstraintsProject(mr);     // r = P(l+diff*r)
        mr = (mr - ml) / grad_diffstep;  // r = (P(l+diff*r)-l)/diff

        m_iterations++;

        // Terminate iteration when the projected r is small, if (norm(r,2) <= max(rel_tol_b,abs_tol))
        r_proj_resid = mr.norm();
        if (r_proj_resid < ChMax(rel_tol_b, abs_tol)) {
            if (verbose)
                GetLog() << "Iter=" << iter << " P(r)-converged!  |P(r)|=" << r_proj_resid << "\n";
            break;
        }

        // z_old = z;
        mz_old = mz;

        // z = Mi*r;                                 %% -- Precond
        if (m_use_precond)
            mz = mr.array() * mDi.array();
        else
            mz = mr;

        // NMr_old = NMr;
        mNMr_old = mNMr;

        // NMr = N*z;
        sysd.ShurComplementProduct(mNMr, mz);  // NMr = N*z

        // beta = z'*(NMr-NMr_old)/(z_old'*(NMr_old));
        mtmp = mNMr - mNMr_old;
        double numerator = mz.dot(mtmp);
        double denominator = mz_old.dot(mNMr_old);
        double beta = numerator / denominator;

        // Robustness improver: restart if beta=0 or too large
        if (fabs(denominator) < 10e-30 || fabs(numerator) < 10e-30) {
            if (verbose)
                GetLog() << "Iter=" << iter << " Ribiere quotient beta restart: " << numerator << " / " << denominator
                         << "\n";
            beta = 0;
        }

        // beta = ChMax(0.0, beta); //***NOT NEEDED!!! (may be negative in not positive def.matrices!)

        // p = z + beta * p;
        mp = mz + beta * mp;

        // Np = NMr + beta*Np;   // Optimization!! avoid matr x vect!!! (if no 'p' projection has been done)
        mNp = mNMr + beta * mNp;

        // ---------------------------------------------
        // METRICS - convergence, plots, etc

        // For recording into correction/residuals/violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(r_proj_resid, maxdeltalambda, iter);
    }

    // Resulting DUAL variables:
    // store ml temporary vector into ChConstraint 'l_i' multipliers
    sysd.FromVectorToConstraints(ml);

    // Resulting PRIMAL variables:
    // compute the primal variables as   v = (M^-1)(k + D*l)

    // v = (M^-1)*k  ...    (by rewinding to the backup vector computed ad the beginning)
    sysd.FromVectorToVariables(mq);

    // ... + (M^-1)*D*l     (this increment and also stores 'qb' in the ChVariable items)
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->IsActive())
            mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    }

    if (verbose)
        GetLog() << "-----\n";

    return r_proj_resid;
}